

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O0

void __thiscall capnp::MembraneHook::removeFromMap(MembraneHook *this)

{
  bool bVar1;
  MembranePolicy *pMVar2;
  HashMap<capnp::ClientHook*,capnp::ClientHook*> *local_48;
  Fault local_30;
  Fault f;
  bool local_1a;
  DebugExpression<bool> local_19;
  HashMap<capnp::ClientHook*,capnp::ClientHook*> *pHStack_18;
  DebugExpression<bool> _kjCondition;
  HashMap<capnp::ClientHook_*,_capnp::ClientHook_*> *map;
  MembraneHook *this_local;
  
  if ((this->reverse & 1U) == 0) {
    pMVar2 = kj::Own<capnp::MembranePolicy,_std::nullptr_t>::operator->(&this->policy);
    local_48 = (HashMap<capnp::ClientHook*,capnp::ClientHook*> *)&pMVar2->wrappers;
  }
  else {
    pMVar2 = kj::Own<capnp::MembranePolicy,_std::nullptr_t>::operator->(&this->policy);
    local_48 = (HashMap<capnp::ClientHook*,capnp::ClientHook*> *)&pMVar2->reverseWrappers;
  }
  pHStack_18 = local_48;
  f.exception = (Exception *)kj::Own<capnp::ClientHook,_std::nullptr_t>::get(&this->inner);
  local_1a = kj::HashMap<capnp::ClientHook*,capnp::ClientHook*>::erase<capnp::ClientHook*>
                       (local_48,(ClientHook **)&f);
  local_19 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1a);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_19);
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
              (&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/membrane.c++"
               ,0x229,FAILED,"map.erase(inner.get())","_kjCondition,",&local_19);
    kj::_::Debug::Fault::fatal(&local_30);
  }
  return;
}

Assistant:

void removeFromMap() noexcept {
    // Remove this object from the policy's wrapper map.

    auto& map = reverse ? policy->reverseWrappers : policy->wrappers;

    // If this map.erase() fails, there's a good chance we have left a dangling pointer somewhere,
    // hence this method is declared `noexcept` so that we end up crashing promptly.
    KJ_ASSERT(map.erase(inner.get()));
  }